

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QMimeData * __thiscall QListModel::mimeData(QListModel *this,QModelIndexList *indexes)

{
  long lVar1;
  int iVar2;
  qsizetype qVar3;
  const_reference this_00;
  QListWidget *pQVar4;
  QMimeData *pQVar5;
  QList<QModelIndex> *in_RSI;
  long in_RDI;
  QList<QModelIndex> *this_01;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QMimeData *mimeData;
  int i;
  int indexesCount;
  QList<QListWidgetItem_*> itemlist;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QListModel *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QListWidgetItem_*>::QList((QList<QListWidgetItem_*> *)0x89b798);
  qVar3 = QList<QModelIndex>::size(in_RSI);
  iVar2 = (int)qVar3;
  QList<QListWidgetItem_*>::reserve
            ((QList<QListWidgetItem_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),in_stack_00000008
            );
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    this_00 = QList<QModelIndex>::at
                        ((QList<QModelIndex> *)in_stack_ffffffffffffffa0,
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QModelIndex::row(this_00);
    at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    QList<QListWidgetItem_*>::operator<<
              ((QList<QListWidgetItem_*> *)in_stack_ffffffffffffffa0,
               (parameter_type)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  this_01 = (QList<QModelIndex> *)(in_RDI + 0x28);
  QList<QModelIndex>::operator=
            (this_01,(QList<QModelIndex> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pQVar4 = view((QListModel *)0x89b826);
  pQVar5 = (QMimeData *)
           (**(code **)(*(long *)&(pQVar4->super_QListView).super_QAbstractItemView.
                                  super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x308))();
  QList<QModelIndex>::clear(this_01);
  QList<QListWidgetItem_*>::~QList((QList<QListWidgetItem_*> *)0x89b862);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QListModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QListWidgetItem*> itemlist;
    const int indexesCount = indexes.size();
    itemlist.reserve(indexesCount);
    for (int i = 0; i < indexesCount; ++i)
        itemlist << at(indexes.at(i).row());

    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(itemlist);
    cachedIndexes.clear();
    return mimeData;
}